

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

void __thiscall
kj::Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>_>::reserve
          (Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>_> *this,
          size_t size)

{
  long lVar1;
  ulong newSize;
  
  lVar1 = *(long *)(this + 0x10) - *(long *)this;
  if ((ulong)(lVar1 >> 4) < size) {
    newSize = 4;
    if (*(long *)(this + 0x10) != *(long *)this) {
      newSize = lVar1 >> 3;
    }
    if (newSize < size) {
      newSize = size;
    }
    Vector<kj::StringPtr>::setCapacity((Vector<kj::StringPtr> *)this,newSize);
  }
  _::BTreeImpl::reserve((BTreeImpl *)(this + 0x28),size);
  return;
}

Assistant:

void Table<Row, Indexes...>::reserve(size_t size) {
  rows.reserve(size);
  Impl<>::reserve(*this, size);
}